

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * parserStackRealloc(void *pOld,sqlite3_uint64 newSize)

{
  int iVar1;
  void *pvVar2;
  u64 nBytes;
  
  if ((sqlite3Config.xTestCallback != (_func_int_int *)0x0) &&
     (iVar1 = (*sqlite3Config.xTestCallback)(700), iVar1 != 0)) {
    return (void *)0x0;
  }
  iVar1 = sqlite3_initialize();
  if (iVar1 != 0) {
    return (void *)0x0;
  }
  nBytes = 0;
  if (0 < (int)newSize) {
    nBytes = newSize & 0xffffffff;
  }
  pvVar2 = sqlite3Realloc(pOld,nBytes);
  return pvVar2;
}

Assistant:

static void *parserStackRealloc(void *pOld, sqlite3_uint64 newSize){
    return sqlite3FaultSim(700) ? 0 : sqlite3_realloc(pOld, newSize);
  }